

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86assembler.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::x86::X86BufferWriter::emitImmByteOrDWord
          (X86BufferWriter *this,uint64_t immValue,FastUInt8 immSize)

{
  char in_DL;
  ulong in_RSI;
  CodeWriter *in_RDI;
  uint64_t imm;
  char *in_stack_000003c0;
  int in_stack_000003cc;
  char *in_stack_000003d0;
  
  if (in_DL != '\0') {
    if (in_DL != '\x01' && in_DL != '\x04') {
      DebugUtils::assertionFailed(in_stack_000003d0,in_stack_000003cc,in_stack_000003c0);
    }
    CodeWriter::emit8<unsigned_long>(in_RDI,in_RSI & 0xff);
    if (in_DL != '\x01') {
      CodeWriter::emit8<unsigned_long>(in_RDI,in_RSI >> 8 & 0xff);
      CodeWriter::emit8<unsigned_long>(in_RDI,in_RSI >> 0x10 & 0xff);
      CodeWriter::emit8<unsigned_long>(in_RDI,in_RSI >> 0x18 & 0xff);
    }
  }
  return;
}

Assistant:

ASMJIT_FORCE_INLINE void emitImmByteOrDWord(uint64_t immValue, FastUInt8 immSize) noexcept {
    if (!immSize)
      return;

    ASMJIT_ASSERT(immSize == 1 || immSize == 4);

#if ASMJIT_ARCH_BITS >= 64
    uint64_t imm = uint64_t(immValue);
#else
    uint32_t imm = uint32_t(immValue & 0xFFFFFFFFu);
#endif

    // Many instructions just use a single byte immediate, so make it fast.
    emit8(imm & 0xFFu);
    if (immSize == 1) return;

    imm >>= 8;
    emit8(imm & 0xFFu);
    imm >>= 8;
    emit8(imm & 0xFFu);
    imm >>= 8;
    emit8(imm & 0xFFu);
  }